

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O3

shared_ptr<kratos::FunctionCallStmt> *
kratos::FSM::get_func_call_stmt
          (shared_ptr<kratos::FunctionStmtBlock> *func_def,FSMState *fsm_state,
          shared_ptr<kratos::FunctionCallStmt> *func_stmt)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_t *__args;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  shared_ptr<kratos::FunctionCallStmt> *psVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  _Base_ptr p_Var5;
  element_type *peVar6;
  _Base_ptr p_Var7;
  _Rb_tree_header *p_Var8;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  mapping;
  shared_ptr<kratos::Var> var_to_;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_78;
  shared_ptr<kratos::FunctionStmtBlock> *local_68;
  shared_ptr<kratos::FunctionCallStmt> *local_60;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  _func_int **local_48;
  pointer ppStack_40;
  
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&mapping;
  mapping._M_t._M_impl._0_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  p_Var5 = (fsm_state->output_values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(fsm_state->output_values_)._M_t._M_impl.super__Rb_tree_header;
  mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       mapping._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_68 = func_def;
  local_60 = func_stmt;
  if ((_Rb_tree_header *)p_Var5 != p_Var8) {
    __args = &mapping._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var1 = &var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    do {
      p_Var7 = p_Var5[1]._M_parent;
      if (p_Var7 == (_Base_ptr)0x0) {
        p_Var7 = *(_Base_ptr *)(p_Var5 + 1);
      }
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)__args,
                 (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)&p_Var7[3]._M_parent);
      (**(code **)(**(long **)(p_Var5 + 1) + 0xf8))(p_Var1);
      plVar4 = (long *)std::__cxx11::string::append((char *)p_Var1);
      peVar6 = (element_type *)(plVar4 + 2);
      if ((element_type *)*plVar4 == peVar6) {
        local_48 = (peVar6->super_Stmt).super_IRNode._vptr_IRNode;
        ppStack_40 = (pointer)plVar4[3];
        local_58 = (element_type *)&stack0xffffffffffffffb8;
      }
      else {
        local_48 = (peVar6->super_Stmt).super_IRNode._vptr_IRNode;
        local_58 = (element_type *)*plVar4;
      }
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar4[1];
      *plVar4 = (long)peVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
      ::_M_emplace_unique<std::__cxx11::string,std::shared_ptr<kratos::Var>&>
                ((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_bool>
                  *)local_c8,
                 (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                  *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args,
                 (shared_ptr<kratos::Var> *)peVar6);
      if (local_58 != (element_type *)&stack0xffffffffffffffb8) {
        operator_delete(local_58,(long)local_48 + 1);
      }
      if (var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          &local_78) {
        operator_delete(var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,(long)local_78._vptr__Sp_counted_base + 1);
      }
      if (var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != p_Var8);
  }
  std::__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::FunctionCallStmt>,std::shared_ptr<kratos::FunctionStmtBlock>const&,std::map<std::__cxx11::string,std::shared_ptr<kratos::Var>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>&>
            ((__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2> *)&local_58,
             (_Sp_alloc_shared_tag<std::allocator<kratos::FunctionCallStmt>_>)
             &var_to_.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             local_68,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
                       *)local_c8);
  p_Var3 = p_Stack_50;
  peVar6 = local_58;
  psVar2 = local_60;
  local_58 = (element_type *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (local_60->super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  (local_60->super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       peVar6;
  (local_60->super___shared_ptr<kratos::FunctionCallStmt,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
  _M_pi = p_Var3;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
               *)local_c8);
  return psVar2;
}

Assistant:

std::shared_ptr<FunctionCallStmt>& FSM::get_func_call_stmt(
    const std::shared_ptr<FunctionStmtBlock>& func_def, const FSMState* fsm_state,
    std::shared_ptr<FunctionCallStmt>& func_stmt) {
    // get arg mapping
    std::map<std::string, std::shared_ptr<Var>> mapping;
    auto const& output_values = fsm_state->output_values();
    for (auto const& [var_from, var_to] : output_values) {
        std::shared_ptr<Var> var_to_ =
            var_to ? var_to->shared_from_this() : var_from->shared_from_this();
        mapping.emplace(var_from->to_string() + "_value", var_to_);
    }
    func_stmt = std::make_shared<FunctionCallStmt>(func_def, mapping);
    return func_stmt;
}